

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDConstructGridGlobal.hpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
TasGrid::listToNodes<TasGrid::GridSequence>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *node_list,
          size_t num_dimensions,GridSequence *rule)

{
  pointer pdVar1;
  _Fwd_list_node_base *p_Var2;
  _Fwd_list_node_base *p_Var3;
  double *pdVar4;
  long lVar5;
  _Fwd_list_node_base *p_Var6;
  allocator_type local_19;
  
  lVar5 = 0;
  for (p_Var3 = (node_list->
                super__Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>)._M_impl
                ._M_head._M_next; p_Var3 != (_Fwd_list_node_base *)0x0; p_Var3 = p_Var3->_M_next) {
    lVar5 = lVar5 + 1;
  }
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,
             lVar5 * num_dimensions,&local_19);
  p_Var3 = (node_list->super__Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>).
           _M_impl._M_head._M_next;
  if (p_Var3 != (_Fwd_list_node_base *)0x0) {
    pdVar4 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (rule->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      p_Var2 = p_Var3[2]._M_next;
      for (p_Var6 = p_Var3[1]._M_next; p_Var6 != p_Var2;
          p_Var6 = (_Fwd_list_node_base *)((long)&p_Var6->_M_next + 4)) {
        *pdVar4 = pdVar1[*(int *)&p_Var6->_M_next];
        pdVar4 = pdVar4 + 1;
      }
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_Fwd_list_node_base *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> listToNodes(std::forward_list<NodeData> const &node_list, size_t num_dimensions, RuleLike const &rule){
    std::vector<double> result(Utils::size_mult(std::distance(node_list.begin(), node_list.end()), num_dimensions));
    auto ix = result.begin();
    for(auto const &t : node_list)
        ix = MultiIndexManipulations::indexesToNodes(t.point, rule, ix);
    return result;
}